

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode connect_SOCKS(connectdata *conn,int sockindex,_Bool *done)

{
  curl_proxytype cVar1;
  ulong uVar2;
  char *hostname;
  CURLproxycode CVar3;
  CURLcode CVar4;
  long lVar5;
  uint remote_port;
  
  uVar2 = *(ulong *)&(conn->bits).field_0x4;
  if ((uVar2 & 2) == 0) {
    *done = true;
    return CURLE_OK;
  }
  lVar5 = 0x3d0;
  if (((uVar2 & 1) == 0) && (lVar5 = 0x370, ((uint)uVar2 >> 8 & 1) == 0)) {
    lVar5 = 0x340;
    if (sockindex == 1) {
      lVar5 = 0x358;
    }
  }
  if ((uVar2 & 1) == 0) {
    if (sockindex == 1) {
      remote_port = (uint)conn->secondary_port;
    }
    else if (((uint)uVar2 >> 9 & 1) == 0) {
      remote_port = conn->remote_port;
    }
    else {
      remote_port = conn->conn_to_port;
    }
  }
  else {
    remote_port = (uint)(conn->http_proxy).port;
  }
  cVar1 = (conn->socks_proxy).proxytype;
  if (cVar1 - CURLPROXY_SOCKS4 < 4) {
    hostname = *(char **)((conn->cnnct).socksreq + lVar5 + -0xc);
    switch(cVar1) {
    default:
      CVar3 = Curl_SOCKS4((conn->socks_proxy).user,hostname,remote_port,sockindex,conn,done);
      break;
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      CVar3 = Curl_SOCKS5((conn->socks_proxy).user,(conn->socks_proxy).passwd,hostname,remote_port,
                          sockindex,conn,done);
    }
    CVar4 = CURLE_OK;
  }
  else {
    CVar3 = CURLPX_OK;
    Curl_failf(conn->data,"unknown proxytype option given");
    CVar4 = CURLE_COULDNT_CONNECT;
  }
  if (CVar3 != CURLPX_OK) {
    (conn->data->info).pxcode = CVar3;
    CVar4 = CURLE_PROXY;
  }
  return CVar4;
}

Assistant:

static CURLcode connect_SOCKS(struct connectdata *conn, int sockindex,
                              bool *done)
{
  CURLcode result = CURLE_OK;
#ifndef CURL_DISABLE_PROXY
  CURLproxycode pxresult = CURLPX_OK;
  if(conn->bits.socksproxy) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    const char * const host =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    const int port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    switch(conn->socks_proxy.proxytype) {
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      pxresult = Curl_SOCKS5(conn->socks_proxy.user, conn->socks_proxy.passwd,
                             host, port, sockindex, conn, done);
      break;

    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      pxresult = Curl_SOCKS4(conn->socks_proxy.user, host, port, sockindex,
                             conn, done);
      break;

    default:
      failf(conn->data, "unknown proxytype option given");
      result = CURLE_COULDNT_CONNECT;
    } /* switch proxytype */
    if(pxresult) {
      result = CURLE_PROXY;
      conn->data->info.pxcode = pxresult;
    }
  }
  else
#else
    (void)conn;
    (void)sockindex;
#endif /* CURL_DISABLE_PROXY */
    *done = TRUE; /* no SOCKS proxy, so consider us connected */

  return result;
}